

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validate.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  _Alloc_hider _Var1;
  Result RVar2;
  wabt *this;
  Callback *callback;
  uint uVar3;
  string_view filename;
  ReadBinaryOptions options;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  ValidateOptions options_1;
  undefined6 uStack_3b6;
  Errors errors;
  OptionParser parser;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wasm-validate",
             "  Read a file in the WebAssembly binary format, and validate it.\n\nexamples:\n  # validate binary file test.wasm\n  $ wasm-validate test.wasm\n"
            );
  options.features.exceptions_enabled_ = false;
  options.features.mutable_globals_enabled_ = false;
  options.features.sat_float_to_int_enabled_ = false;
  options.features.sign_extension_enabled_ = false;
  options.features.simd_enabled_ = false;
  options.features.threads_enabled_ = false;
  options.features.function_references_enabled_ = false;
  options.features.multi_value_enabled_ = false;
  options.features.tail_call_enabled_ = false;
  options.features.bulk_memory_enabled_ = false;
  options.features.reference_types_enabled_ = false;
  options.features.annotations_enabled_ = false;
  options.features.code_metadata_enabled_ = false;
  options.features.gc_enabled_ = false;
  options.features.memory64_enabled_ = false;
  options.features.multi_memory_enabled_ = false;
  options.log_stream =
       (Stream *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-validate.cc:51:72)>
       ::_M_invoke;
  options._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-validate.cc:51:72)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&options);
  if (options._16_8_ != 0) {
    (*(code *)options._16_8_)(&options,&options,3);
  }
  wabt::Features::AddOptions(&s_features,&parser);
  options.features.exceptions_enabled_ = false;
  options.features.mutable_globals_enabled_ = false;
  options.features.sat_float_to_int_enabled_ = false;
  options.features.sign_extension_enabled_ = false;
  options.features.simd_enabled_ = false;
  options.features.threads_enabled_ = false;
  options.features.function_references_enabled_ = false;
  options.features.multi_value_enabled_ = false;
  options.features.tail_call_enabled_ = false;
  options.features.bulk_memory_enabled_ = false;
  options.features.reference_types_enabled_ = false;
  options.features.annotations_enabled_ = false;
  options.features.code_metadata_enabled_ = false;
  options.features.gc_enabled_ = false;
  options.features.memory64_enabled_ = false;
  options.features.multi_memory_enabled_ = false;
  options.log_stream =
       (Stream *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-validate.cc:57:20)>
       ::_M_invoke;
  options._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-validate.cc:57:20)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-debug-names","Ignore debug names in the binary file",
             (NullCallback *)&options);
  if (options._16_8_ != 0) {
    (*(code *)options._16_8_)(&options,&options,3);
  }
  options.features.exceptions_enabled_ = false;
  options.features.mutable_globals_enabled_ = false;
  options.features.sat_float_to_int_enabled_ = false;
  options.features.sign_extension_enabled_ = false;
  options.features.simd_enabled_ = false;
  options.features.threads_enabled_ = false;
  options.features.function_references_enabled_ = false;
  options.features.multi_value_enabled_ = false;
  options.features.tail_call_enabled_ = false;
  options.features.bulk_memory_enabled_ = false;
  options.features.reference_types_enabled_ = false;
  options.features.annotations_enabled_ = false;
  options.features.code_metadata_enabled_ = false;
  options.features.gc_enabled_ = false;
  options.features.memory64_enabled_ = false;
  options.features.multi_memory_enabled_ = false;
  options.log_stream =
       (Stream *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-validate.cc:60:20)>
       ::_M_invoke;
  options._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-validate.cc:60:20)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"ignore-custom-section-errors","Ignore errors in custom sections",
             (NullCallback *)&options);
  if (options._16_8_ != 0) {
    (*(code *)options._16_8_)(&options,&options,3);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&options,"filename",(allocator<char> *)&file_data);
  callback = (Callback *)&options_1;
  options_1.features.exceptions_enabled_ = false;
  options_1.features.mutable_globals_enabled_ = false;
  options_1.features.sat_float_to_int_enabled_ = false;
  options_1.features.sign_extension_enabled_ = false;
  options_1.features.simd_enabled_ = false;
  options_1.features.threads_enabled_ = false;
  options_1.features.function_references_enabled_ = false;
  options_1.features.multi_value_enabled_ = false;
  options_1.features.tail_call_enabled_ = false;
  options_1.features.bulk_memory_enabled_ = false;
  options_1.features.reference_types_enabled_ = false;
  options_1.features.annotations_enabled_ = false;
  options_1.features.code_metadata_enabled_ = false;
  options_1.features.gc_enabled_ = false;
  options_1.features.memory64_enabled_ = false;
  options_1.features.multi_memory_enabled_ = false;
  stack0xfffffffffffffc48 =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm-validate.cc:62:22)>
       ::_M_manager;
  wabt::OptionParser::AddArgument(&parser,(string *)&options,One,callback);
  if (stack0xfffffffffffffc48 != (_Manager_type)0x0) {
    (*stack0xfffffffffffffc48)(&options_1,&options_1,3);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  wabt::OptionParser::~OptionParser(&parser);
  _Var1 = s_infile_abi_cxx11_._M_dataplus;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this = (wabt *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
  filename._M_str = (char *)&file_data;
  filename._M_len = (size_t)_Var1._M_p;
  RVar2 = wabt::ReadFile(this,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  if (RVar2.enum_ == Ok) {
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wabt::Module::Module((Module *)&parser);
    options.read_debug_names = (bool)(s_read_debug_names ^ 1);
    options.fail_on_custom_section_error = (bool)(s_fail_on_custom_section_error ^ 1);
    options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    options.features.simd_enabled_ = s_features.simd_enabled_;
    options.features.threads_enabled_ = s_features.threads_enabled_;
    options.features.function_references_enabled_ = s_features.function_references_enabled_;
    options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    options.features.annotations_enabled_ = s_features.annotations_enabled_;
    options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    options.features.gc_enabled_ = s_features.gc_enabled_;
    options.features.memory64_enabled_ = s_features.memory64_enabled_;
    options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    options.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    options.stop_on_first_error = true;
    options.skip_function_bodies = false;
    RVar2 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,
                               file_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)file_data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)file_data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&options,&errors,
                               (Module *)&parser);
    if (RVar2.enum_ == Ok) {
      options_1.features.extended_const_enabled_ = s_features.extended_const_enabled_;
      options_1.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
      options_1.features.exceptions_enabled_ = s_features.exceptions_enabled_;
      options_1.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      options_1.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
      options_1.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
      options_1.features.simd_enabled_ = s_features.simd_enabled_;
      options_1.features.threads_enabled_ = s_features.threads_enabled_;
      options_1.features.function_references_enabled_ = s_features.function_references_enabled_;
      options_1.features.multi_value_enabled_ = s_features.multi_value_enabled_;
      options_1.features.tail_call_enabled_ = s_features.tail_call_enabled_;
      options_1.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
      options_1.features.reference_types_enabled_ = s_features.reference_types_enabled_;
      options_1.features.annotations_enabled_ = s_features.annotations_enabled_;
      options_1.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
      options_1.features.gc_enabled_ = s_features.gc_enabled_;
      options_1.features.memory64_enabled_ = s_features.memory64_enabled_;
      options_1.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
      RVar2 = wabt::ValidateModule((Module *)&parser,&errors,&options_1);
      uVar3 = (uint)(RVar2.enum_ != Ok);
    }
    else {
      uVar3 = 1;
    }
    options_1.features._0_8_ = &options_1.features.extended_const_enabled_;
    options_1.features.tail_call_enabled_ = false;
    options_1.features.bulk_memory_enabled_ = false;
    options_1.features.reference_types_enabled_ = false;
    options_1.features.annotations_enabled_ = false;
    options_1.features.code_metadata_enabled_ = false;
    options_1.features.gc_enabled_ = false;
    options_1.features.memory64_enabled_ = false;
    options_1.features.multi_memory_enabled_ = false;
    stack0xfffffffffffffc48 = (code *)((ulong)stack0xfffffffffffffc48 & 0xffffffffffffff00);
    wabt::FormatErrorsToFile
              (&errors,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&options_1,Never,0x50);
    std::__cxx11::string::_M_dispose();
    wabt::Module::~Module((Module *)&parser);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  }
  else {
    uVar3 = 1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar3;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              s_fail_on_custom_section_error);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      ValidateOptions options(s_features);
      result = ValidateModule(&module, &errors, options);
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}